

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O3

ConstPixelBufferAccess *
tcu::toSamplerAccess<tcu::ConstPixelBufferAccess>
          (ConstPixelBufferAccess *__return_storage_ptr__,ConstPixelBufferAccess *baseAccess,
          DepthStencilMode mode)

{
  ChannelType CVar1;
  ConstPixelBufferAccess *in_RAX;
  ConstPixelBufferAccess *extraout_RAX;
  void *data;
  TextureFormat local_8;
  
  CVar1 = (baseAccess->m_format).type;
  if ((int)CVar1 < 0x1a) {
    if (CVar1 == UNSIGNED_INT_16_8_8) {
      if (mode != MODE_STENCIL) {
        if (mode != MODE_DEPTH) {
LAB_003287a5:
          ConstPixelBufferAccess::ConstPixelBufferAccess(__return_storage_ptr__);
          return extraout_RAX;
        }
        local_8.order = D;
        local_8.type = UNORM_INT16;
        data = (void *)((long)baseAccess->m_data + 2);
        goto LAB_003287c7;
      }
    }
    else {
      if (CVar1 != UNSIGNED_INT_24_8) {
LAB_00328739:
        __return_storage_ptr__->m_format = baseAccess->m_format;
        (__return_storage_ptr__->m_size).m_data[2] = (baseAccess->m_size).m_data[2];
        *(undefined8 *)(__return_storage_ptr__->m_size).m_data =
             *(undefined8 *)(baseAccess->m_size).m_data;
        *(undefined8 *)(__return_storage_ptr__->m_pitch).m_data =
             *(undefined8 *)(baseAccess->m_pitch).m_data;
        (__return_storage_ptr__->m_pitch).m_data[2] = (baseAccess->m_pitch).m_data[2];
        __return_storage_ptr__->m_data = baseAccess->m_data;
        return in_RAX;
      }
      if (mode != MODE_STENCIL) {
        if (mode != MODE_DEPTH) goto LAB_003287a5;
        local_8.order = D;
        local_8.type = UNORM_INT24;
        data = (void *)((long)baseAccess->m_data + 1);
        goto LAB_003287c7;
      }
    }
    local_8.order = S;
    local_8.type = UNSIGNED_INT8;
  }
  else if (CVar1 == UNSIGNED_INT_24_8_REV) {
    if (mode == MODE_STENCIL) {
      local_8.order = S;
      local_8.type = UNSIGNED_INT8;
      data = (void *)((long)baseAccess->m_data + 3);
      goto LAB_003287c7;
    }
    if (mode != MODE_DEPTH) goto LAB_003287a5;
    local_8.order = D;
    local_8.type = UNORM_INT24;
  }
  else {
    if (CVar1 != FLOAT_UNSIGNED_INT_24_8_REV) goto LAB_00328739;
    if (mode == MODE_STENCIL) {
      local_8.order = S;
      local_8.type = UNSIGNED_INT8;
      data = (void *)((long)baseAccess->m_data + 4);
      goto LAB_003287c7;
    }
    if (mode != MODE_DEPTH) goto LAB_003287a5;
    local_8.order = D;
    local_8.type = FLOAT;
  }
  data = baseAccess->m_data;
LAB_003287c7:
  ConstPixelBufferAccess::ConstPixelBufferAccess
            (__return_storage_ptr__,&local_8,&baseAccess->m_size,&baseAccess->m_pitch,data);
  return (ConstPixelBufferAccess *)local_8;
}

Assistant:

static AccessType toSamplerAccess (const AccessType& baseAccess, Sampler::DepthStencilMode mode)
{
	// make sure to update this if type table is updated
	DE_STATIC_ASSERT(TextureFormat::CHANNELTYPE_LAST == 38);

	if (!isCombinedDepthStencilType(baseAccess.getFormat().type))
		return baseAccess;
	else
	{
#if (DE_ENDIANNESS == DE_LITTLE_ENDIAN)
		const deUint32 uint32ByteOffsetBits0To8		= 0; //!< least significant byte in the lowest address
		const deUint32 uint32ByteOffsetBits0To24	= 0;
		const deUint32 uint32ByteOffsetBits8To32	= 1;
		const deUint32 uint32ByteOffsetBits16To32	= 2;
		const deUint32 uint32ByteOffsetBits24To32	= 3;
#else
		const deUint32 uint32ByteOffsetBits0To8		= 3; //!< least significant byte in the highest address
		const deUint32 uint32ByteOffsetBits0To24	= 1;
		const deUint32 uint32ByteOffsetBits8To32	= 0;
		const deUint32 uint32ByteOffsetBits16To32	= 0;
		const deUint32 uint32ByteOffsetBits24To32	= 0;
#endif

		// Sampled channel must exist
		DE_ASSERT(baseAccess.getFormat().order == TextureFormat::DS ||
				  (mode == Sampler::MODE_DEPTH && baseAccess.getFormat().order == TextureFormat::D) ||
				  (mode == Sampler::MODE_STENCIL && baseAccess.getFormat().order == TextureFormat::S));

		// combined formats have multiple channel classes, detect on sampler settings
		switch (baseAccess.getFormat().type)
		{
			case TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV:
			{
				if (mode == Sampler::MODE_DEPTH)
				{
					// select the float component
					return AccessType(TextureFormat(TextureFormat::D, TextureFormat::FLOAT),
									  baseAccess.getSize(),
									  baseAccess.getPitch(),
									  baseAccess.getDataPtr());
				}
				else if (mode == Sampler::MODE_STENCIL)
				{
					// select the uint 8 component
					return AccessType(TextureFormat(TextureFormat::S, TextureFormat::UNSIGNED_INT8),
									  baseAccess.getSize(),
									  baseAccess.getPitch(),
									  addOffset(baseAccess.getDataPtr(), 4 + uint32ByteOffsetBits0To8));
				}
				else
				{
					// unknown sampler mode
					DE_ASSERT(false);
					return AccessType();
				}
			}

			case TextureFormat::UNSIGNED_INT_16_8_8:
			{
				if (mode == Sampler::MODE_DEPTH)
				{
					// select the unorm16 component
					return AccessType(TextureFormat(TextureFormat::D, TextureFormat::UNORM_INT16),
									  baseAccess.getSize(),
									  baseAccess.getPitch(),
									  addOffset(baseAccess.getDataPtr(), uint32ByteOffsetBits16To32));
				}
				else if (mode == Sampler::MODE_STENCIL)
				{
					// select the uint 8 component
					return AccessType(TextureFormat(TextureFormat::S, TextureFormat::UNSIGNED_INT8),
									  baseAccess.getSize(),
									  baseAccess.getPitch(),
									  addOffset(baseAccess.getDataPtr(), uint32ByteOffsetBits0To8));
				}
				else
				{
					// unknown sampler mode
					DE_ASSERT(false);
					return AccessType();
				}
			}

			case TextureFormat::UNSIGNED_INT_24_8:
			{
				if (mode == Sampler::MODE_DEPTH)
				{
					// select the unorm24 component
					return AccessType(TextureFormat(TextureFormat::D, TextureFormat::UNORM_INT24),
									  baseAccess.getSize(),
									  baseAccess.getPitch(),
									  addOffset(baseAccess.getDataPtr(), uint32ByteOffsetBits8To32));
				}
				else if (mode == Sampler::MODE_STENCIL)
				{
					// select the uint 8 component
					return AccessType(TextureFormat(TextureFormat::S, TextureFormat::UNSIGNED_INT8),
									  baseAccess.getSize(),
									  baseAccess.getPitch(),
									  addOffset(baseAccess.getDataPtr(), uint32ByteOffsetBits0To8));
				}
				else
				{
					// unknown sampler mode
					DE_ASSERT(false);
					return AccessType();
				}
			}

			case TextureFormat::UNSIGNED_INT_24_8_REV:
			{
				if (mode == Sampler::MODE_DEPTH)
				{
					// select the unorm24 component
					return AccessType(TextureFormat(TextureFormat::D, TextureFormat::UNORM_INT24),
									  baseAccess.getSize(),
									  baseAccess.getPitch(),
									  addOffset(baseAccess.getDataPtr(), uint32ByteOffsetBits0To24));
				}
				else if (mode == Sampler::MODE_STENCIL)
				{
					// select the uint 8 component
					return AccessType(TextureFormat(TextureFormat::S, TextureFormat::UNSIGNED_INT8),
									  baseAccess.getSize(),
									  baseAccess.getPitch(),
									  addOffset(baseAccess.getDataPtr(), uint32ByteOffsetBits24To32));
				}
				else
				{
					// unknown sampler mode
					DE_ASSERT(false);
					return AccessType();
				}
			}

			default:
			{
				// unknown combined format
				DE_ASSERT(false);
				return AccessType();
			}
		}
	}
}